

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

iterator * __thiscall
ghc::filesystem::path::iterator::operator++
          (iterator *__return_storage_ptr__,iterator *this,int param_1)

{
  iterator(__return_storage_ptr__,this);
  operator++(this);
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path::iterator path::iterator::operator++(int)
{
    path::iterator i{*this};
    ++(*this);
    return i;
}